

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtcTimeStampTestCase.cpp
# Opt level: O0

void __thiscall SuiteUtcTimeStampTests::Testsubtract::RunImpl(Testsubtract *this)

{
  int64_t *lhs;
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_2d0;
  int local_2b0 [10];
  TestDetails local_288;
  int local_268 [10];
  TestDetails local_240;
  int local_220 [10];
  TestDetails local_1f8;
  int local_1d8 [10];
  TestDetails local_1b0;
  int local_190 [10];
  TestDetails local_168;
  int local_148 [10];
  TestDetails local_120;
  int local_100 [10];
  TestDetails local_d8;
  int local_b8 [10];
  TestDetails local_90;
  int local_70 [2];
  undefined1 local_68 [8];
  UtcTimeStamp mid;
  undefined1 local_40 [8];
  UtcTimeStamp lg;
  UtcTimeStamp sm;
  Testsubtract *this_local;
  
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&lg.super_DateTime.m_time,10,10,10,10,10,2000);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_40,10,10,0x14,10,10,2000);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_68,10,10,0xf,10,10,2000);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_70[1] = 0;
  lhs = &lg.super_DateTime.m_time;
  local_70[0] = FIX::operator-((DateTime *)lhs,(DateTime *)lhs);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_90,*ppTVar3,0x4a);
  UnitTest::CheckEqual<int,int>(pTVar1,local_70 + 1,local_70,&local_90);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_b8[1] = 0xfffffff6;
  local_b8[0] = FIX::operator-((DateTime *)&lg.super_DateTime.m_time,(DateTime *)local_40);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_d8,*ppTVar3,0x4b);
  UnitTest::CheckEqual<int,int>(pTVar1,local_b8 + 1,local_b8,&local_d8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_100[1] = 0xfffffffb;
  local_100[0] = FIX::operator-((DateTime *)&lg.super_DateTime.m_time,(DateTime *)local_68);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_120,*ppTVar3,0x4c);
  UnitTest::CheckEqual<int,int>(pTVar1,local_100 + 1,local_100,&local_120);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_148[1] = 5;
  local_148[0] = FIX::operator-((DateTime *)local_68,(DateTime *)&lg.super_DateTime.m_time);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_168,*ppTVar3,0x4e);
  UnitTest::CheckEqual<int,int>(pTVar1,local_148 + 1,local_148,&local_168);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_190[1] = 0xfffffffb;
  local_190[0] = FIX::operator-((DateTime *)local_68,(DateTime *)local_40);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1b0,*ppTVar3,0x4f);
  UnitTest::CheckEqual<int,int>(pTVar1,local_190 + 1,local_190,&local_1b0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_1d8[1] = 0;
  local_1d8[0] = FIX::operator-((DateTime *)local_68,(DateTime *)local_68);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1f8,*ppTVar3,0x50);
  UnitTest::CheckEqual<int,int>(pTVar1,local_1d8 + 1,local_1d8,&local_1f8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_220[1] = 10;
  local_220[0] = FIX::operator-((DateTime *)local_40,(DateTime *)&lg.super_DateTime.m_time);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_240,*ppTVar3,0x52);
  UnitTest::CheckEqual<int,int>(pTVar1,local_220 + 1,local_220,&local_240);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_268[1] = 0;
  local_268[0] = FIX::operator-((DateTime *)local_40,(DateTime *)local_40);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_288,*ppTVar3,0x53);
  UnitTest::CheckEqual<int,int>(pTVar1,local_268 + 1,local_268,&local_288);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2b0[1] = 5;
  local_2b0[0] = FIX::operator-((DateTime *)local_40,(DateTime *)local_68);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_2d0,*ppTVar3,0x54);
  UnitTest::CheckEqual<int,int>(pTVar1,local_2b0 + 1,local_2b0,&local_2d0);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_68);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_40);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&lg.super_DateTime.m_time);
  return;
}

Assistant:

TEST(subtract)
{
  UtcTimeStamp sm( 10, 10, 10, 10, 10, 2000 );
  UtcTimeStamp lg( 10, 10, 20, 10, 10, 2000 );
  UtcTimeStamp mid( 10, 10, 15, 10, 10, 2000 );

  CHECK_EQUAL( 0, ( sm - sm ) );
  CHECK_EQUAL( -10, ( sm - lg ) );
  CHECK_EQUAL( -5, ( sm - mid ) );

  CHECK_EQUAL( 5, ( mid - sm ) );
  CHECK_EQUAL( -5, ( mid - lg ) );
  CHECK_EQUAL( 0, ( mid - mid ) );

  CHECK_EQUAL( 10, ( lg - sm ) );
  CHECK_EQUAL( 0, ( lg - lg ) );
  CHECK_EQUAL( 5, ( lg - mid ) );
}